

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

bool __thiscall
iutest::detail::TypedTestSuitePState::VerifyTestNames
          (TypedTestSuitePState *this,char *file,int line,char *test_names)

{
  char *__needle;
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  int iVar5;
  bool bVar6;
  string local_1e0;
  undefined1 local_1c0 [400];
  
  this->m_names = test_names;
  p_Var4 = (this->m_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = true;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->m_list)._M_t._M_impl.super__Rb_tree_header) {
      return bVar6;
    }
    __needle = *(char **)(p_Var4 + 1);
    pcVar1 = strstr(test_names,__needle);
    if (pcVar1 == (char *)0x0) {
LAB_00128fe9:
      iVar5 = 0x1c8;
      IUTestLog::IUTestLog
                ((IUTestLog *)local_1c0,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
                 ,0x1c8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&local_1e0,(detail *)file,(char *)(ulong)(uint)line,iVar5);
      poVar3 = std::operator<<((ostream *)(local_1c0 + 0x18),(string *)&local_1e0);
      poVar3 = std::operator<<(poVar3,": Test \"");
      poVar3 = std::operator<<(poVar3,__needle);
      poVar3 = std::operator<<(poVar3,"\" has not been registered.\n");
      poVar3 = std::operator<<(poVar3,"    TestNames: ");
      std::operator<<(poVar3,test_names);
      std::__cxx11::string::~string((string *)&local_1e0);
      IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
      bVar6 = false;
    }
    else {
      sVar2 = strlen(__needle);
      if ((0x2c < (ulong)(byte)pcVar1[sVar2]) ||
         ((0x100100000201U >> ((ulong)(byte)pcVar1[sVar2] & 0x3f) & 1) == 0)) {
        iVar5 = 0x1c4;
        IUTestLog::IUTestLog
                  ((IUTestLog *)local_1c0,LOG_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
                   ,0x1c4);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_1e0,(detail *)file,(char *)(ulong)(uint)line,iVar5);
        poVar3 = std::operator<<((ostream *)(local_1c0 + 0x18),(string *)&local_1e0);
        poVar3 = std::operator<<(poVar3,": Test \"");
        poVar3 = std::operator<<(poVar3,__needle);
        poVar3 = std::operator<<(poVar3,"\" is find in \"");
        poVar3 = std::operator<<(poVar3,test_names);
        poVar3 = std::operator<<(poVar3,"\". expected whitespace or comma : ");
        poVar3 = std::operator<<(poVar3,pcVar1[sVar2]);
        poVar3 = std::operator<<(poVar3,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)pcVar1[sVar2]);
        std::operator<<(poVar3,")\n");
        std::__cxx11::string::~string((string *)&local_1e0);
        IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
        goto LAB_00128fe9;
      }
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

bool VerifyTestNames(const char* file, int line, const char* test_names)
    {
        m_names = test_names;
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
#if IUTEST_TYPED_TEST_P_STRICT
        bool ret = true;
        for( nameset_t::iterator it=m_list.begin(), end=m_list.end(); it != end; ++it )
        {
            const char* test_name = *it;
            const char* p = strstr(test_names, test_name);
            if( p != NULL )
            {
                const size_t len = strlen(test_name);
                if( p[len] == '\0' || p[len] == ',' || detail::IsSpace(p[len]) )
                {
                    continue;
                }
                IUTEST_LOG_(FATAL) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" is find in \"" << test_names
                    << "\". expected whitespace or comma : " << p[len] << "(" << static_cast<int>(p[len]) <<  ")\n";
            }
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" has not been registered.\n" << "    TestNames: " << test_names;
            ret = false;
        }
        return ret;
#else
        IUTEST_UNUSED_VAR(file);
        IUTEST_UNUSED_VAR(line);
        return true;
#endif
        IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
    }